

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::EnsureLdFldInlineeCodeGenRuntimeData
          (FunctionBody *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionBody *inlinee)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  void *pvVar7;
  Recycler *pRVar8;
  char *pcVar9;
  FunctionCodeGenRuntimeData *this_00;
  undefined1 local_70 [8];
  TrackAllocData data;
  Type inlineeData;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa3,"(recycler)","recycler");
    if (!bVar3) goto LAB_0076f2f6;
    *puVar6 = 0;
  }
  uVar4 = GetCountField(this,InlineCacheCount);
  if (uVar4 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa4,"(inlineCacheIndex < this->GetInlineCacheCount())",
                                "inlineCacheIndex < this->GetInlineCacheCount()");
    if (!bVar3) goto LAB_0076f2f6;
    *puVar6 = 0;
  }
  if (inlinee == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa5,"(inlinee)","inlinee");
    if (!bVar3) goto LAB_0076f2f6;
    *puVar6 = 0;
  }
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData);
  if (pvVar7 == (void *)0x0) {
    uVar4 = GetCountField(this,InlineCacheCount);
    data.plusSize = (size_t)uVar4;
    local_70 = (undefined1  [8])&FunctionCodeGenRuntimeData*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x1aa9;
    pRVar8 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    uVar4 = GetCountField(this,InlineCacheCount);
    if (uVar4 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
      pcVar9 = &DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_0076f2f6;
        *puVar6 = 0;
      }
      pcVar9 = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (pRVar8,(ulong)uVar4 << 3);
      if (pcVar9 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_0076f2f6:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        pcVar9 = (char *)0x0;
      }
    }
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData,pcVar9);
  }
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData);
  uVar1 = *(undefined8 *)((long)pvVar7 + (ulong)inlineCacheIndex * 8);
  Memory::Recycler::WBSetBit((char *)&data.line);
  data._32_8_ = uVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&data.line);
  if (data._32_8_ == 0) {
    pcVar9 = (char *)((long)pvVar7 + (ulong)inlineCacheIndex * 8);
    local_70 = (undefined1  [8])&FunctionCodeGenRuntimeData::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x1ab4;
    pRVar8 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    this_00 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar8,0x387914);
    FunctionCodeGenRuntimeData::FunctionCodeGenRuntimeData(this_00,inlinee);
    Memory::Recycler::WBSetBit(pcVar9);
    *(FunctionCodeGenRuntimeData **)pcVar9 = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar9);
    data._32_8_ = *(undefined8 *)pcVar9;
  }
  return (FunctionCodeGenRuntimeData *)data._32_8_;
}

Assistant:

FunctionCodeGenRuntimeData *FunctionBody::EnsureLdFldInlineeCodeGenRuntimeData(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(inlineCacheIndex < this->GetInlineCacheCount());
        Assert(inlinee);

        if (this->GetCodeGenGetSetRuntimeData() == nullptr)
        {
            const auto codeGenRuntimeData = RecyclerNewArrayZ(recycler, FunctionCodeGenRuntimeData *, this->GetInlineCacheCount());
            this->SetCodeGenGetSetRuntimeData(codeGenRuntimeData);
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        const auto inlineeData = codeGenGetSetRuntimeData[inlineCacheIndex];
        if (inlineeData)
        {
            return inlineeData;
        }

        return codeGenGetSetRuntimeData[inlineCacheIndex] = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
    }